

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

BigAttr * attrset_append_attr(BigAttrSet *attrset)

{
  size_t sVar1;
  BigAttr *pBVar2;
  BigAttr *a;
  BigAttrSet *attrset_local;
  
  while (attrset->listsize == attrset->listused) {
    pBVar2 = (BigAttr *)realloc(attrset->attrlist,attrset->listsize << 6);
    attrset->attrlist = pBVar2;
    attrset->listsize = attrset->listsize << 1;
  }
  pBVar2 = attrset->attrlist;
  sVar1 = attrset->listused;
  attrset->listused = sVar1 + 1;
  memset(pBVar2 + sVar1,0,0x20);
  return pBVar2 + sVar1;
}

Assistant:

static BigAttr *
attrset_append_attr(BigAttrSet * attrset)
{
    while(attrset->listsize - attrset->listused < 1) {
        attrset->attrlist = realloc(attrset->attrlist, attrset->listsize * 2 * sizeof(BigAttr));
        attrset->listsize *= 2;
    }
    BigAttr * a = & (attrset->attrlist[attrset->listused++]);
    memset(a, 0, sizeof(BigAttr));
    return a;
}